

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

iterator __thiscall Json::Value::end(Value *this)

{
  long lVar1;
  undefined8 in_RDX;
  long *in_RSI;
  long lVar2;
  bool bVar3;
  iterator iVar4;
  
  bVar3 = (*(ushort *)(in_RSI + 1) & 0xfe) != 6;
  lVar1 = *in_RSI;
  iVar4.super_ValueIteratorBase._9_7_ = (undefined7)((ulong)in_RDX >> 8);
  iVar4.super_ValueIteratorBase.isNull_ = lVar1 == 0 || bVar3;
  lVar2 = 0;
  if (lVar1 != 0 && !bVar3) {
    lVar2 = lVar1 + 8;
  }
  (this->value_).int_ = lVar2;
  this->field_0x8 = iVar4.super_ValueIteratorBase.isNull_;
  iVar4.super_ValueIteratorBase.current_._M_node = (_Base_ptr)this;
  return (iterator)iVar4.super_ValueIteratorBase;
}

Assistant:

Value::iterator Value::end() {
  switch (type_) {
#ifdef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
    if (value_.array_) {
      ValueInternalArray::IteratorState it;
      value_.array_->makeEndIterator(it);
      return iterator(it);
    }
    break;
  case objectValue:
    if (value_.map_) {
      ValueInternalMap::IteratorState it;
      value_.map_->makeEndIterator(it);
      return iterator(it);
    }
    break;
#else
  case arrayValue:
  case objectValue:
    if (value_.map_)
      return iterator(value_.map_->end());
    break;
#endif
  default:
    break;
  }
  return iterator();
}